

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

ssize_t __thiscall
sznet::net::TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  bool bVar1;
  size_t in_RAX;
  undefined4 in_register_00000034;
  Buffer *this_01;
  undefined1 local_c0 [56];
  code *local_88;
  undefined8 local_80;
  string local_78;
  Functor local_58;
  TcpConnection *local_38;
  
  this_01 = (Buffer *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    bVar1 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar1) {
      sendInLoop(this,(this_01->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + this_01->m_readerIndex,
                 this_01->m_writerIndex - this_01->m_readerIndex);
      in_RAX = this_01->m_nCheapPrepend;
      this_01->m_readerIndex = in_RAX;
      this_01->m_writerIndex = in_RAX;
    }
    else {
      local_88 = sendInLoop;
      local_80 = 0;
      this_00 = this->m_loop;
      local_38 = this;
      Buffer::retrieveAllAsString_abi_cxx11_(&local_78,this_01);
      std::
      _Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>
      ::_Bind<sznet::net::TcpConnection*,std::__cxx11::string>
                ((_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>
                  *)local_c0,(offset_in_TcpConnection_to_subr *)&local_88,&local_38,&local_78);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>,void>
                ((function<void()> *)&local_58,
                 (_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
                  *)local_c0);
      EventLoop::runInLoop(this_00,&local_58);
      std::_Function_base::~_Function_base(&local_58.super__Function_base);
      std::__cxx11::string::~string((string *)(local_c0 + 0x10));
      in_RAX = std::__cxx11::string::~string((string *)&local_78);
    }
  }
  return in_RAX;
}

Assistant:

void TcpConnection::send(Buffer* buf)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(buf->peek(), buf->readableBytes());
			buf->retrieveAll();
		}
		else
		{
			void (TcpConnection::*fp)(const StringPiece& message) = &TcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, buf->retrieveAllAsString()));
		}
	}
}